

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O0

void __thiscall
libtorrent::find_control_url(libtorrent *this,int type,string_view str,parse_state *state)

{
  string_view s1;
  string_view s1_00;
  string_view s1_01;
  string_view s1_02;
  string_view s1_03;
  parse_state *ppVar1;
  bool bVar2;
  reference pvVar3;
  string *psVar4;
  ulong uVar5;
  size_type sVar6;
  const_iterator pvVar7;
  const_iterator pvVar8;
  undefined4 in_register_00000034;
  string_view local_128;
  size_t local_118;
  char *local_110;
  string_view local_108;
  string_view local_f8;
  string_view local_e8;
  string_view local_d8;
  string_view local_c8;
  size_t local_b8;
  char *local_b0;
  string_view local_a8;
  size_t local_98;
  char *local_90;
  string_view local_88;
  size_t local_78;
  char *local_70;
  string_view local_68;
  string_view local_58;
  string_view local_48;
  size_t local_38;
  char *local_30;
  parse_state *local_28;
  parse_state *state_local;
  undefined1 auStack_18 [4];
  int type_local;
  string_view str_local;
  
  _auStack_18 = CONCAT44(in_register_00000034,type);
  local_28 = (parse_state *)str._M_str;
  str_local._M_len = str._M_len;
  state_local._4_4_ = (int)this;
  if (state_local._4_4_ == 0) {
    ::std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::push_back(&local_28->tag_stack,(value_type *)auStack_18);
  }
  else if (state_local._4_4_ == 1) {
    bVar2 = ::std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::empty(&local_28->tag_stack);
    if (!bVar2) {
      if ((local_28->in_service & 1U) != 0) {
        pvVar3 = ::std::
                 vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::back(&local_28->tag_stack);
        local_38 = pvVar3->_M_len;
        local_30 = pvVar3->_M_str;
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&local_48,"service");
        s1_03._M_str = local_30;
        s1_03._M_len = local_38;
        bVar2 = aux::string_equal_no_case(s1_03,local_48);
        if (bVar2) {
          local_28->in_service = false;
        }
      }
      ::std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::pop_back(&local_28->tag_stack);
    }
  }
  else if ((state_local._4_4_ == 4) &&
          (bVar2 = ::std::
                   vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::empty(&local_28->tag_stack), ppVar1 = local_28, !bVar2)) {
    if ((local_28->in_service & 1U) == 0) {
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_58,"service");
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_68,"servicetype");
      bVar2 = parse_state::top_tags(ppVar1,local_58,local_68);
      if ((bVar2) && (uVar5 = ::std::__cxx11::string::empty(), (uVar5 & 1) != 0)) {
        local_78 = _auStack_18;
        local_70 = (char *)str_local._M_len;
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&local_88,
                   "urn:schemas-upnp-org:service:WANIPConnection:1");
        s1_02._M_str = local_70;
        s1_02._M_len = local_78;
        bVar2 = aux::string_equal_no_case(s1_02,local_88);
        if (!bVar2) {
          local_98 = _auStack_18;
          local_90 = (char *)str_local._M_len;
          ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_a8,
                     "urn:schemas-upnp-org:service:WANIPConnection:2");
          s1_01._M_str = local_90;
          s1_01._M_len = local_98;
          bVar2 = aux::string_equal_no_case(s1_01,local_a8);
          if (!bVar2) {
            local_b8 = _auStack_18;
            local_b0 = (char *)str_local._M_len;
            ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)&local_c8,
                       "urn:schemas-upnp-org:service:WANPPPConnection:1");
            s1_00._M_str = local_b0;
            s1_00._M_len = local_b8;
            bVar2 = aux::string_equal_no_case(s1_00,local_c8);
            if (!bVar2) {
              return;
            }
          }
        }
        psVar4 = &local_28->service_type;
        pvVar7 = ::std::basic_string_view<char,_std::char_traits<char>_>::begin
                           ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18);
        pvVar8 = ::std::basic_string_view<char,_std::char_traits<char>_>::end
                           ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18);
        ::std::__cxx11::string::assign<char_const*,void>((string *)psVar4,pvVar7,pvVar8);
        local_28->in_service = true;
        return;
      }
    }
    uVar5 = ::std::__cxx11::string::empty();
    ppVar1 = local_28;
    if (((uVar5 & 1) != 0) && ((local_28->in_service & 1U) != 0)) {
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_d8,"service");
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_e8,"controlurl");
      bVar2 = parse_state::top_tags(ppVar1,local_d8,local_e8);
      if ((bVar2) &&
         (sVar6 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18),
         sVar6 != 0)) {
        psVar4 = &local_28->control_url;
        pvVar7 = ::std::basic_string_view<char,_std::char_traits<char>_>::begin
                           ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18);
        pvVar8 = ::std::basic_string_view<char,_std::char_traits<char>_>::end
                           ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18);
        ::std::__cxx11::string::assign<char_const*,void>((string *)psVar4,pvVar7,pvVar8);
        return;
      }
    }
    uVar5 = ::std::__cxx11::string::empty();
    ppVar1 = local_28;
    if ((uVar5 & 1) != 0) {
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f8,"device")
      ;
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_108,"modelname");
      bVar2 = parse_state::top_tags(ppVar1,local_f8,local_108);
      if (bVar2) {
        psVar4 = &local_28->model;
        pvVar7 = ::std::basic_string_view<char,_std::char_traits<char>_>::begin
                           ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18);
        pvVar8 = ::std::basic_string_view<char,_std::char_traits<char>_>::end
                           ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18);
        ::std::__cxx11::string::assign<char_const*,void>((string *)psVar4,pvVar7,pvVar8);
        return;
      }
    }
    pvVar3 = ::std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::back(&local_28->tag_stack);
    local_118 = pvVar3->_M_len;
    local_110 = pvVar3->_M_str;
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&local_128,"urlbase");
    s1._M_str = local_110;
    s1._M_len = local_118;
    bVar2 = aux::string_equal_no_case(s1,local_128);
    if (bVar2) {
      psVar4 = &local_28->url_base;
      pvVar7 = ::std::basic_string_view<char,_std::char_traits<char>_>::begin
                         ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18);
      pvVar8 = ::std::basic_string_view<char,_std::char_traits<char>_>::end
                         ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18);
      ::std::__cxx11::string::assign<char_const*,void>((string *)psVar4,pvVar7,pvVar8);
    }
  }
  return;
}

Assistant:

void find_control_url(int const type, string_view str, parse_state& state)
{
	if (type == xml_start_tag)
	{
		state.tag_stack.push_back(str);
	}
	else if (type == xml_end_tag)
	{
		if (!state.tag_stack.empty())
		{
			if (state.in_service && string_equal_no_case(state.tag_stack.back(), "service"))
				state.in_service = false;
			state.tag_stack.pop_back();
		}
	}
	else if (type == xml_string)
	{
		if (state.tag_stack.empty()) return;
		// default to the first (or only) control url in the router's listing
		if (!state.in_service
			&& state.top_tags("service", "servicetype")
			&& state.service_type.empty())
		{
			if (string_equal_no_case(str, "urn:schemas-upnp-org:service:WANIPConnection:1")
				|| string_equal_no_case(str, "urn:schemas-upnp-org:service:WANIPConnection:2")
				|| string_equal_no_case(str, "urn:schemas-upnp-org:service:WANPPPConnection:1"))
			{
				state.service_type.assign(str.begin(), str.end());
				state.in_service = true;
			}
		}
		else if (state.control_url.empty() && state.in_service
			&& state.top_tags("service", "controlurl") && str.size() > 0)
		{
			// default to the first (or only) control url in the router's listing
			state.control_url.assign(str.begin(), str.end());
		}
		else if (state.model.empty() && state.top_tags("device", "modelname"))
		{
			state.model.assign(str.begin(), str.end());
		}
		else if (string_equal_no_case(state.tag_stack.back(), "urlbase"))
		{
			state.url_base.assign(str.begin(), str.end());
		}
	}
}